

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDomainAddEntities
              (FmsDomain domain,FmsEntityType type,int **reordering,FmsIntType ent_id_type,
              void *ents,FmsInt num_ents)

{
  long lVar1;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_R9;
  int *perm;
  void *ents_dst;
  FmsInt num_sides;
  size_t sizeof_side_ids;
  FmsIntType side_ids_type;
  FmsInt num_entities;
  FmsInt in_stack_000001d0;
  void *in_stack_000001d8;
  FmsIntType in_stack_000001e4;
  void *in_stack_000001e8;
  FmsIntType in_stack_000001f0;
  FmsInt in_stack_000007d8;
  int *in_stack_000007e0;
  void *in_stack_000007e8;
  FmsIntType in_stack_000007f4;
  void *in_stack_000007f8;
  FmsIntType in_stack_00000800;
  FmsInt in_stack_00000810;
  undefined8 local_70;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if ((in_ESI == 0) || (7 < in_ESI)) {
    local_4 = 2;
  }
  else {
    lVar1 = *(long *)(in_RDI + (ulong)in_ESI * 8);
    if (*(ulong *)(in_RDI + 0x40 + (ulong)in_ESI * 8) < (ulong)(lVar1 + in_R9)) {
      local_4 = 3;
    }
    else {
      if (in_RDX == 0) {
        local_70 = 0;
      }
      else {
        local_70 = *(long *)(in_RDX + (ulong)in_ESI * 8);
      }
      if (local_70 == 0) {
        FmsIntConvertCopy(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4,in_stack_000001d8,
                          in_stack_000001d0);
      }
      else {
        FmsIntPermuteConvertCopy
                  (in_stack_00000800,in_stack_000007f8,in_stack_000007f4,in_stack_000007e8,
                   in_stack_000007e0,in_stack_000007d8,in_stack_00000810);
      }
      *(long *)(in_RDI + (ulong)in_ESI * 8) = lVar1 + in_R9;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int FmsDomainAddEntities(FmsDomain domain, FmsEntityType type,
                         FmsEntityReordering reordering, FmsIntType ent_id_type,
                         const void *ents, FmsInt num_ents) {
  if (!domain) { E_RETURN(1); }
  if (type == FMS_VERTEX || type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  const FmsInt num_entities = domain->num_entities[type];
  if (num_entities + num_ents > domain->entities_caps[type]) { E_RETURN(3); }
  const FmsIntType side_ids_type = domain->side_ids_type[type];
  const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
  const FmsInt num_sides = FmsEntityNumSides[type];
  void *ents_dst = (char*)(domain->entities[type]) +
                   num_entities*num_sides*sizeof_side_ids;
  const int *perm = reordering ? reordering[type] : NULL;
  if (perm == NULL) {
    FmsIntConvertCopy(ent_id_type, ents, side_ids_type, ents_dst,
                      num_ents*num_sides);
  } else {
    FmsIntPermuteConvertCopy(ent_id_type, ents, side_ids_type, ents_dst,
                             perm, num_sides, num_ents*num_sides);
  }
  domain->num_entities[type] = num_entities + num_ents;
  return 0;
}